

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testbitmap.c
# Opt level: O0

int main(int argc,char **argv)

{
  char cVar1;
  undefined1 uVar2;
  FILE *pFVar3;
  byte bVar4;
  undefined2 uVar5;
  int iVar6;
  undefined8 uVar7;
  short local_480;
  short local_47e;
  undefined2 local_47c;
  undefined2 local_47a;
  SDL_Rect dst;
  SDL_Color palette [256];
  Uint8 gradient;
  Uint16 color;
  Uint16 *buffer16;
  SDL_Event event;
  int local_40;
  int done;
  int k;
  int i;
  Uint8 *buffer;
  Uint32 videoflags;
  Uint8 video_bpp;
  SDL_Surface *bitmap;
  SDL_Surface *screen;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  screen = (SDL_Surface *)argv;
  argv_local._0_4_ = argc;
  iVar6 = SDL_Init(0x20);
  pFVar3 = _stderr;
  if (iVar6 < 0) {
    uVar7 = SDL_GetError();
    fprintf(pFVar3,"Couldn\'t initialize SDL: %s\n",uVar7);
    argv_local._4_4_ = 1;
  }
  else {
    buffer._7_1_ = 0;
    buffer._0_4_ = 0;
    while (1 < (int)argv_local) {
      iVar6 = (int)argv_local + -2;
      argv_local._0_4_ = (int)argv_local + -1;
      iVar6 = strcmp(*(char **)(&screen->flags + (long)iVar6 * 2),"-bpp");
      if (iVar6 == 0) {
        iVar6 = atoi(*(char **)(&screen->flags + (long)(int)argv_local * 2));
        buffer._7_1_ = (byte)iVar6;
        argv_local._0_4_ = (int)argv_local + -1;
      }
      else {
        iVar6 = strcmp(*(char **)(&screen->flags + (long)(int)argv_local * 2),"-warp");
        if (iVar6 == 0) {
          buffer._0_4_ = (uint)buffer | 0x20000000;
        }
        else {
          iVar6 = strcmp(*(char **)(&screen->flags + (long)(int)argv_local * 2),"-hw");
          if (iVar6 == 0) {
            buffer._0_4_ = (uint)buffer | 1;
          }
          else {
            iVar6 = strcmp(*(char **)(&screen->flags + (long)(int)argv_local * 2),"-fullscreen");
            if (iVar6 == 0) {
              buffer._0_4_ = (uint)buffer | 0x80000000;
            }
            else {
              fprintf(_stderr,"Usage: %s [-bpp N] [-warp] [-hw] [-fullscreen]\n",
                      *(undefined8 *)screen);
              quit(1);
            }
          }
        }
      }
    }
    bitmap = (SDL_Surface *)SDL_SetVideoMode(0x280,0x1e0,buffer._7_1_,(uint)buffer);
    bVar4 = buffer._7_1_;
    pFVar3 = _stderr;
    if (bitmap == (SDL_Surface *)0x0) {
      uVar7 = SDL_GetError();
      fprintf(pFVar3,"Couldn\'t set 640x480x%d video mode: %s\n",(ulong)bVar4,uVar7);
      quit(2);
    }
    if (buffer._7_1_ == 8) {
      for (done = 0; done < 0x100; done = done + 1) {
        cVar1 = (char)done;
        palette[(long)done + -2].r = 0xff - cVar1;
        palette[(long)done + -2].g = 0xff - cVar1;
        palette[(long)done + -2].b = 0xff - cVar1;
      }
      SDL_SetColors(bitmap,&dst,0,0x100);
    }
    iVar6 = SDL_LockSurface(bitmap);
    pFVar3 = _stderr;
    if (iVar6 < 0) {
      uVar7 = SDL_GetError();
      fprintf(pFVar3,"Couldn\'t lock the display surface: %s\n",uVar7);
      quit(2);
    }
    _k = bitmap->pixels;
    if (bitmap->format->BytesPerPixel == '\x02') {
      for (done = 0; done < bitmap->h; done = done + 1) {
        uVar2 = (undefined1)((done * 0xff) / bitmap->h);
        uVar5 = SDL_MapRGB(bitmap->format,uVar2,uVar2,uVar2);
        for (local_40 = 0; local_40 < bitmap->w; local_40 = local_40 + 1) {
          *(undefined2 *)((long)_k + (long)local_40 * 2) = uVar5;
        }
        _k = (void *)((long)_k + (long)(int)(uint)bitmap->pitch);
      }
    }
    else {
      for (done = 0; done < bitmap->h; done = done + 1) {
        memset(_k,(done * 0xff) / bitmap->h & 0xff,(ulong)bitmap->pitch);
        _k = (void *)((long)_k + (long)(int)(uint)bitmap->pitch);
      }
    }
    SDL_UnlockSurface(bitmap);
    SDL_UpdateRect(bitmap,0,0,0);
    _videoflags = LoadXBM(bitmap,0x20,0x20,(Uint8 *)picture_bits);
    if (_videoflags == (SDL_Surface *)0x0) {
      quit(1);
    }
    event._20_4_ = 0;
    while (event._20_4_ == 0) {
      while (iVar6 = SDL_PollEvent(&buffer16), iVar6 != 0) {
        if ((char)buffer16 == '\x02') {
          event._20_4_ = 1;
        }
        else if ((char)buffer16 == '\x05') {
          local_480 = buffer16._4_2_ - (short)(_videoflags->w / 2);
          local_47e = buffer16._6_2_ - (short)(_videoflags->h / 2);
          local_47c = (undefined2)_videoflags->w;
          local_47a = (undefined2)_videoflags->h;
          SDL_UpperBlit(_videoflags,0,bitmap,&local_480);
          SDL_UpdateRects(bitmap,1,&local_480);
        }
        else if ((char)buffer16 == '\f') {
          event._20_4_ = 1;
        }
      }
    }
    SDL_FreeSurface(_videoflags);
    SDL_Quit();
    argv_local._4_4_ = 0;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char *argv[])
{
	SDL_Surface *screen;
	SDL_Surface *bitmap;
	Uint8  video_bpp;
	Uint32 videoflags;
	Uint8 *buffer;
	int i, k, done;
	SDL_Event event;
	Uint16 *buffer16;
        Uint16 color;
        Uint8  gradient;
	SDL_Color palette[256];


	/* Initialize SDL */
	if ( SDL_Init(SDL_INIT_VIDEO) < 0 ) {
		fprintf(stderr, "Couldn't initialize SDL: %s\n",SDL_GetError());
		return(1);
	}

	video_bpp = 0;
	videoflags = SDL_SWSURFACE;
	while ( argc > 1 ) {
		--argc;
		if ( strcmp(argv[argc-1], "-bpp") == 0 ) {
			video_bpp = atoi(argv[argc]);
			--argc;
		} else
		if ( strcmp(argv[argc], "-warp") == 0 ) {
			videoflags |= SDL_HWPALETTE;
		} else
		if ( strcmp(argv[argc], "-hw") == 0 ) {
			videoflags |= SDL_HWSURFACE;
		} else
		if ( strcmp(argv[argc], "-fullscreen") == 0 ) {
			videoflags |= SDL_FULLSCREEN;
		} else {
			fprintf(stderr,
			"Usage: %s [-bpp N] [-warp] [-hw] [-fullscreen]\n",
								argv[0]);
			quit(1);
		}
	}

	/* Set 640x480 video mode */
	if ( (screen=SDL_SetVideoMode(640,480,video_bpp,videoflags)) == NULL ) {
		fprintf(stderr, "Couldn't set 640x480x%d video mode: %s\n",
						video_bpp, SDL_GetError());
		quit(2);
	}

	if (video_bpp==8) {
		/* Set a gray colormap, reverse order from white to black */
		for ( i=0; i<256; ++i ) {
			palette[i].r = 255-i;
			palette[i].g = 255-i;
			palette[i].b = 255-i;
		}
		SDL_SetColors(screen, palette, 0, 256);
	}

	/* Set the surface pixels and refresh! */
	if ( SDL_LockSurface(screen) < 0 ) {
		fprintf(stderr, "Couldn't lock the display surface: %s\n",
							SDL_GetError());
		quit(2);
	}
	buffer=(Uint8 *)screen->pixels;
	if (screen->format->BytesPerPixel!=2) {
        	for ( i=0; i<screen->h; ++i ) {
        		memset(buffer,(i*255)/screen->h, screen->pitch);
        		buffer += screen->pitch;
        	}
        }
        else
        {
		for ( i=0; i<screen->h; ++i ) {
			gradient=((i*255)/screen->h);
                        color = SDL_MapRGB(screen->format, gradient, gradient, gradient);
                        buffer16=(Uint16*)buffer;
                        for (k=0; k<screen->w; k++)
                        {
                            *(buffer16+k)=color;
                        }
			buffer += screen->pitch;
		}
        }
	SDL_UnlockSurface(screen);
	SDL_UpdateRect(screen, 0, 0, 0, 0);

	/* Load the bitmap */
	bitmap = LoadXBM(screen, picture_width, picture_height,
					(Uint8 *)picture_bits);
	if ( bitmap == NULL ) {
		quit(1);
	}

	/* Wait for a keystroke */
	done = 0;
	while ( !done ) {
		/* Check for events */
		while ( SDL_PollEvent(&event) ) {
			switch (event.type) {
				case SDL_MOUSEBUTTONDOWN: {
					SDL_Rect dst;

					dst.x = event.button.x - bitmap->w/2;
					dst.y = event.button.y - bitmap->h/2;
					dst.w = bitmap->w;
					dst.h = bitmap->h;
					SDL_BlitSurface(bitmap, NULL,
								screen, &dst);
					SDL_UpdateRects(screen,1,&dst);
					}
					break;
				case SDL_KEYDOWN:
					/* Any key press quits the app... */
					done = 1;
					break;
				case SDL_QUIT:
					done = 1;
					break;
				default:
					break;
			}
		}
	}
	SDL_FreeSurface(bitmap);
	SDL_Quit();
	return(0);
}